

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

void R_CalcTiltedLighting(double lval,double lend,int width)

{
  BYTE *pBVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  BYTE *in_R8;
  BYTE **ppBVar7;
  double dVar8;
  double dVar9;
  
  uVar6 = (ulong)(uint)width;
  pBVar1 = basecolormap->Maps;
  iVar3 = 0x1f;
  if ((width == 0) || (lval == lend)) {
    if (24.0 <= lval) {
      lval = 24.0;
    }
    iVar5 = planeshade - SUB84(lval + 103079215104.0,0) >> 0x10;
    if (iVar5 < 0x1f) {
      iVar3 = iVar5;
    }
    uVar2 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    in_R8 = pBVar1 + (uint)(iVar3 << 8);
  }
  else {
    dVar8 = (lend - lval) / (double)width;
    uVar4 = (ulong)width;
    if (24.0 <= lval) {
      dVar9 = 24.0;
      if (lval <= 24.0) {
        dVar9 = lval;
      }
      iVar5 = planeshade - SUB84(dVar9 + 103079215104.0,0) >> 0x10;
      if (0x1e < iVar5) {
        iVar5 = iVar3;
      }
      uVar2 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      in_R8 = pBVar1 + (uint)(iVar5 << 8);
      ppBVar7 = tiltlighting;
      for (; ((long)uVar2 <= (long)uVar4 && (24.0 <= lval)); lval = lval + dVar8) {
        *ppBVar7 = in_R8;
        uVar2 = uVar2 + 1;
        ppBVar7 = ppBVar7 + 1;
      }
    }
    else {
      uVar2 = 0;
    }
    if (24.0 <= lend) {
      dVar9 = 24.0;
      if (lend <= 24.0) {
        dVar9 = lend;
      }
      iVar5 = planeshade - SUB84(dVar9 + 103079215104.0,0) >> 0x10;
      if (iVar5 < 0x1f) {
        iVar3 = iVar5;
      }
      iVar5 = 0;
      if (0 < iVar3) {
        iVar5 = iVar3;
      }
      in_R8 = pBVar1 + (uint)(iVar5 << 8);
      ppBVar7 = tiltlighting + uVar4;
      for (; ((long)(int)uVar2 < (long)uVar4 && (24.0 <= lend)); lend = lend - dVar8) {
        *ppBVar7 = in_R8;
        uVar4 = uVar4 - 1;
        ppBVar7 = ppBVar7 + -1;
      }
      uVar6 = uVar4 & 0xffffffff;
    }
    width = (int)uVar6;
    if (0 < width) {
      dVar9 = (double)planeshade * 1.52587890625e-05 - lval;
      dVar8 = (lval - lend) / (double)width;
      if (0.0 <= dVar8) {
        if (dVar9 < 31.0) {
          uVar2 = uVar2 & 0xffffffff;
          ppBVar7 = tiltlighting + uVar2;
          for (; (dVar9 < 0.0 && (uVar2 <= uVar6)); uVar2 = uVar2 + 1) {
            *ppBVar7 = pBVar1;
            dVar9 = dVar9 + dVar8;
            ppBVar7 = ppBVar7 + 1;
          }
          if (width < (int)uVar2) {
            return;
          }
          for (; (uVar2 <= uVar6 && (dVar9 < 31.0)); dVar9 = dVar9 + dVar8) {
            uVar2 = uVar2 + 1;
            *ppBVar7 = pBVar1 + (SUB84(dVar9 + 6755399441055744.0,0) << 8);
            ppBVar7 = ppBVar7 + 1;
          }
        }
        in_R8 = pBVar1 + 0x1f00;
      }
      else {
        in_R8 = pBVar1;
        if (1.0 <= dVar9) {
          if (32.0 <= dVar9) {
            uVar2 = uVar2 & 0xffffffff;
            ppBVar7 = tiltlighting + uVar2;
            for (; (32.0 <= dVar9 && (uVar2 <= uVar6)); uVar2 = uVar2 + 1) {
              *ppBVar7 = pBVar1 + 0x1f00;
              dVar9 = dVar9 + dVar8;
              ppBVar7 = ppBVar7 + 1;
            }
            if (width < (int)uVar2) {
              return;
            }
          }
          uVar2 = uVar2 & 0xffffffff;
          ppBVar7 = tiltlighting + uVar2;
          for (; (uVar2 <= uVar6 && (0.0 <= dVar9)); dVar9 = dVar9 + dVar8) {
            uVar2 = uVar2 + 1;
            *ppBVar7 = pBVar1 + (SUB84(dVar9 + 6755399441055744.0,0) << 8);
            ppBVar7 = ppBVar7 + 1;
          }
        }
      }
    }
  }
  uVar2 = uVar2 & 0xffffffff;
  ppBVar7 = tiltlighting + uVar2;
  for (; (long)uVar2 <= (long)width; uVar2 = uVar2 + 1) {
    *ppBVar7 = in_R8;
    ppBVar7 = ppBVar7 + 1;
  }
  return;
}

Assistant:

void R_CalcTiltedLighting (double lval, double lend, int width)
{
	double lstep;
	BYTE *lightfiller;
	BYTE *basecolormapdata = basecolormap->Maps;
	int i = 0;

	if (width == 0 || lval == lend)
	{ // Constant lighting
		lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
	}
	else
	{
		lstep = (lend - lval) / width;
		if (lval >= MAXLIGHTVIS)
		{ // lval starts "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
			for (; i <= width && lval >= MAXLIGHTVIS; ++i)
			{
				tiltlighting[i] = lightfiller;
				lval += lstep;
			}
		}
		if (lend >= MAXLIGHTVIS)
		{ // lend ends "too bright".
			lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
			for (; width > i && lend >= MAXLIGHTVIS; --width)
			{
				tiltlighting[width] = lightfiller;
				lend -= lstep;
			}
		}
		if (width > 0)
		{
			lval = FIXED2DBL(planeshade) - lval;
			lend = FIXED2DBL(planeshade) - lend;
			lstep = (lend - lval) / width;
			if (lstep < 0)
			{ // Going from dark to light
				if (lval < 1.)
				{ // All bright
					lightfiller = basecolormapdata;
				}
				else
				{
					if (lval >= NUMCOLORMAPS)
					{ // Starts beyond the dark end
						BYTE *clight = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
						while (lval >= NUMCOLORMAPS && i <= width)
						{
							tiltlighting[i++] = clight;
							lval += lstep;
						}
						if (i > width)
							return;
					}
					while (i <= width && lval >= 0)
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata;
				}
			}
			else
			{ // Going from light to dark
				if (lval >= (NUMCOLORMAPS-1))
				{ // All dark
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
				else
				{
					while (lval < 0 && i <= width)
					{
						tiltlighting[i++] = basecolormapdata;
						lval += lstep;
					}
					if (i > width)
						return;
					while (i <= width && lval < (NUMCOLORMAPS-1))
					{
						tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
						lval += lstep;
					}
					lightfiller = basecolormapdata + ((NUMCOLORMAPS-1) << COLORMAPSHIFT);
				}
			}
		}
	}
	for (; i <= width; i++)
	{
		tiltlighting[i] = lightfiller;
	}
}